

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  TString *pTVar1;
  
  pTVar1 = createstrobj(L,l,0x14,L->l_G->seed);
  (pTVar1->u).lnglen = l;
  return pTVar1;
}

Assistant:

TString *luaS_createlngstrobj(lua_State *L, size_t l) {
    TString *ts = createstrobj(L, l, LUA_TLNGSTR, G(L)->seed);
    ts->u.lnglen = l;
    return ts;
}